

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

uint * vector_sum(uint *a,uint a_len,uint *b,uint b_len,uint *new_len)

{
  uint *puVar1;
  uint local_3c;
  uint i;
  uint *c;
  uint *new_len_local;
  uint b_len_local;
  uint *b_local;
  uint a_len_local;
  uint *a_local;
  
  if (a_len != b_len) {
    fatal((uchar *)"vector_sum",(uchar *)"a_len should be equal to b_len\n");
  }
  puVar1 = vector_new(a_len);
  if (new_len != (uint *)0x0) {
    *new_len = a_len;
  }
  for (local_3c = 0; local_3c < a_len; local_3c = local_3c + 1) {
    puVar1[local_3c] = a[local_3c] + b[local_3c];
  }
  return puVar1;
}

Assistant:

uint32_t *vector_sum(uint32_t *a, uint32_t a_len, uint32_t *b, uint32_t b_len, uint32_t *new_len)
{
    if (a_len != b_len)
        fatal("vector_sum", "a_len should be equal to b_len\n");

    uint32_t *c = vector_new(a_len);

    if (new_len != NULL)
        *new_len = a_len;

    for (uint32_t i = 0; i < a_len; i++)
        c[i] = a[i] + b[i];
    return c;
}